

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

string_view __thiscall RenX::Server::getPrefix(Server *this)

{
  int iVar1;
  string_view sVar2;
  
  if (getPrefix()::parsed_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getPrefix()::parsed_abi_cxx11_);
    if (iVar1 != 0) {
      getPrefix()::parsed_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getPrefix()::parsed_abi_cxx11_.field_2;
      getPrefix()::parsed_abi_cxx11_._M_string_length = 0;
      getPrefix()::parsed_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&getPrefix()::parsed_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getPrefix()::parsed_abi_cxx11_);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&getPrefix()::parsed_abi_cxx11_,&this->m_IRCPrefix);
  processTags(&getPrefix()::parsed_abi_cxx11_,this,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
              (BuildingInfo *)0x0);
  sVar2._M_str = getPrefix()::parsed_abi_cxx11_._M_dataplus._M_p;
  sVar2._M_len = getPrefix()::parsed_abi_cxx11_._M_string_length;
  return sVar2;
}

Assistant:

std::string_view RenX::Server::getPrefix() const {
	static std::string parsed; // TODO: What the hell?
	RenX::processTags(parsed = m_IRCPrefix, this);
	return parsed;
}